

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O0

void __thiscall
Diligent::
DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>::
DeviceObjectBase(DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                 *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
                TopLevelASDesc *ObjDesc,bool bIsDeviceInternal)

{
  RAYTRACING_BUILD_AS_FLAGS RVar1;
  undefined3 uVar2;
  int iVar3;
  Char *Message;
  size_t sVar4;
  IMemoryAllocator *pIVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char (*Args_1) [21];
  uint local_98;
  char *AddressStr;
  size_t size_1;
  char *NameCopy;
  size_t size;
  string msg;
  bool bIsDeviceInternal_local;
  TopLevelASDesc *ObjDesc_local;
  RenderDeviceVkImpl *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
  *this_local;
  
  ObjectBase<Diligent::ITopLevelASVk>::ObjectBase
            (&this->super_ObjectBase<Diligent::ITopLevelASVk>,pRefCounters);
  (this->super_ObjectBase<Diligent::ITopLevelASVk>).super_RefCountedObject<Diligent::ITopLevelASVk>.
  super_ITopLevelASVk.super_ITopLevelAS.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_010d6848;
  this->m_pDevice = pDevice;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (ObjDesc->super_DeviceObjectAttribs).Name;
  RVar1 = ObjDesc->Flags;
  uVar2 = *(undefined3 *)&ObjDesc->field_0xd;
  (this->m_Desc).MaxInstanceCount = ObjDesc->MaxInstanceCount;
  (this->m_Desc).Flags = RVar1;
  *(undefined3 *)&(this->m_Desc).field_0xd = uVar2;
  (this->m_Desc).CompactedSize = ObjDesc->CompactedSize;
  (this->m_Desc).ImmediateContextMask = ObjDesc->ImmediateContextMask;
  if (pDevice == (RenderDeviceVkImpl *)0x0) {
    local_98 = 0;
  }
  else {
    local_98 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GenerateUniqueId
                         ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pDevice);
  }
  Args_1 = (char (*) [21])(ulong)local_98;
  this->m_UniqueID = local_98;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  RefCntAutoPtr<Diligent::IObject>::RefCntAutoPtr(&this->m_pUserData);
  if ((this->m_bIsDeviceInternal & 1U) == 0) {
    if (this->m_pDevice == (RenderDeviceVkImpl *)0x0) {
      FormatString<char[26],char[21]>
                ((string *)&size,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pDevice != nullptr",Args_1);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      std::__cxx11::string::~string((string *)&size);
    }
    RefCountedObject<Diligent::IRenderDeviceVk>::AddRef
              ((RefCountedObject<Diligent::IRenderDeviceVk> *)this->m_pDevice);
  }
  if ((ObjDesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
    pIVar5 = GetStringAllocator();
    iVar3 = (**pIVar5->_vptr_IMemoryAllocator)
                      (pIVar5,0x13,"Object address string",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                       ,0x55);
    snprintf((char *)CONCAT44(extraout_var_00,iVar3),0x13,"0x%llX",this);
    (this->m_Desc).super_DeviceObjectAttribs.Name = (char *)CONCAT44(extraout_var_00,iVar3);
  }
  else {
    sVar4 = strlen((ObjDesc->super_DeviceObjectAttribs).Name);
    pIVar5 = GetStringAllocator();
    iVar3 = (**pIVar5->_vptr_IMemoryAllocator)
                      (pIVar5,sVar4 + 1,"Object name copy",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                       ,0x4e);
    memcpy((Char *)CONCAT44(extraout_var,iVar3),(ObjDesc->super_DeviceObjectAttribs).Name,sVar4 + 1)
    ;
    (this->m_Desc).super_DeviceObjectAttribs.Name = (Char *)CONCAT44(extraout_var,iVar3);
  }
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }